

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

void set_slots_and_values(Am_Object *fake_start_object,Am_Value_List *slots_and_values_used)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *value;
  Am_Value local_80;
  Am_Value local_70;
  Am_Am_Slot_Key local_5a;
  undefined1 local_58 [8];
  Am_Value_List just_slots;
  undefined1 local_38 [8];
  Am_Value target_v;
  Am_Slot_Key key;
  Am_Assoc as;
  Am_Value_List *slots_and_values_used_local;
  Am_Object *fake_start_object_local;
  
  as.data = (Am_Assoc_Data *)slots_and_values_used;
  Am_Assoc::Am_Assoc((Am_Assoc *)&stack0xffffffffffffffe0);
  Am_Value::Am_Value((Am_Value *)local_38);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_58);
  Am_Value_List::Start((Am_Value_List *)as.data);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)as.data);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_value = Am_Value_List::Get((Am_Value_List *)as.data);
    Am_Assoc::operator=((Am_Assoc *)&stack0xffffffffffffffe0,in_value);
    Am_Assoc::Value_1((Am_Assoc *)&local_70);
    Am_Am_Slot_Key::Am_Am_Slot_Key(&local_5a,&local_70);
    target_v.value.long_value._6_2_ = Am_Am_Slot_Key::operator_cast_to_unsigned_short(&local_5a);
    Am_Value::~Am_Value(&local_70);
    Am_Assoc::Value_2((Am_Assoc *)&local_80);
    Am_Value::operator=((Am_Value *)local_38,&local_80);
    Am_Value::~Am_Value(&local_80);
    Am_Object::Set(fake_start_object,target_v.value.long_value._6_2_,(Am_Value *)local_38,1);
    Am_Value_List::Add((Am_Value_List *)local_58,(uint)(ushort)target_v.value.long_value._6_2_,
                       Am_TAIL,true);
    Am_Value_List::Next((Am_Value_List *)as.data);
  }
  value = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_58);
  Am_Object::Set(fake_start_object,0xb8,value,1);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_58);
  Am_Value::~Am_Value((Am_Value *)local_38);
  Am_Assoc::~Am_Assoc((Am_Assoc *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void
set_slots_and_values(Am_Object &fake_start_object,
                     Am_Value_List &slots_and_values_used)
{
  Am_Assoc as;
  Am_Slot_Key key;
  Am_Value target_v;
  Am_Value_List just_slots;
  for (slots_and_values_used.Start(); !slots_and_values_used.Last();
       slots_and_values_used.Next()) {
    as = slots_and_values_used.Get();
    key = Am_Am_Slot_Key(as.Value_1());
    target_v = as.Value_2();
    fake_start_object.Set(key, target_v, Am_OK_IF_NOT_THERE);
    just_slots.Add((int)key);
  }
  fake_start_object.Set(Am_SLOTS_TO_SAVE, just_slots, Am_OK_IF_NOT_THERE);
}